

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiKeyData * ImGui::GetKeyData(ImGuiKey key)

{
  ImGuiKey IVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  if ((key & ImGuiMod_Mask_) != ImGuiKey_KeysData_OFFSET) {
    key = ConvertSingleModFlagToKey(key);
  }
  if ((key < ImGuiKey_NamedKey_BEGIN) &&
     (IVar1 = (pIVar2->IO).KeyMap[key], IVar1 != ~ImGuiKey_KeysData_OFFSET)) {
    key = IVar1;
  }
  return (pIVar2->IO).KeysData + (int)key;
}

Assistant:

ImGuiKeyData* ImGui::GetKeyData(ImGuiKey key)
{
    ImGuiContext& g = *GImGui;

    // Special storage location for mods
    if (key & ImGuiMod_Mask_)
        key = ConvertSingleModFlagToKey(key);

    int index;
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT(key >= ImGuiKey_LegacyNativeKey_BEGIN && key < ImGuiKey_NamedKey_END);
    if (IsLegacyKey(key))
        index = (g.IO.KeyMap[key] != -1) ? g.IO.KeyMap[key] : key; // Remap native->imgui or imgui->native
    else
        index = key;
#else
    IM_ASSERT(IsNamedKey(key) && "Support for user key indices was dropped in favor of ImGuiKey. Please update backend & user code.");
    index = key - ImGuiKey_NamedKey_BEGIN;
#endif
    return &g.IO.KeysData[index];
}